

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plastic.hpp
# Opt level: O2

void __thiscall PlasticBSDF::PlasticBSDF(PlasticBSDF *this,Json *conf)

{
  const_reference this_00;
  int iVar1;
  bool bVar2;
  float fVar3;
  double dVar4;
  vec3f vVar5;
  MT19937Sampler sampler;
  Sampler local_13a8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  BSDF::BSDF(&this->super_BSDF,conf);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_00160bf0;
  this_00 = nlohmann::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        *)conf,"ior");
  fVar3 = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::get<float,_float,_0>(this_00);
  *(float *)&(this->super_BSDF).field_0x24 = fVar3;
  local_13a8._vptr_Sampler = (_func_int **)&PTR_get1f_00160108;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,0);
  dVar4 = 0.0;
  iVar1 = 1000000;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    vVar5 = Sampler::cosSampleHemisphereSurface(&local_13a8);
    fVar3 = DielectricBRDF::reflectivity(vVar5.z,1.0 / *(float *)&(this->super_BSDF).field_0x24);
    dVar4 = dVar4 + (double)(1.0 - fVar3);
  }
  this->outRatio = (float)(dVar4 / 1000000.0);
  return;
}

Assistant:

PlasticBSDF(const Json& conf): BSDF(conf)
	{
		IOR = conf["ior"];
		// precompute outRatio
		// here bruteforcing to demonstrate its physical meaning
		// you can optimize by using approximating polynormial
		MT19937Sampler sampler;
		const int nsample = 1000000;
		double energy = 0; // use double here because accumulating process introduces lots of rounding error
		for (int i=0; i<nsample; ++i) {
			vec3f lambert_out = sampler.cosSampleHemisphereSurface();
			energy += 1 - DielectricBRDF::reflectivity(lambert_out.z, 1/IOR);
		}
		outRatio = energy / nsample;
	}